

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Accuracy::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 dVar2;
  TextureCube *this_00;
  TextureCube *pTVar3;
  PixelBufferAccess *access;
  RGBA local_50;
  Vec4 local_4c;
  uint local_3c;
  uint local_38;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int faceNdx;
  int numLevels;
  TextureCubeMipmapCase *local_10;
  TextureCubeMipmapCase *this_local;
  
  local_10 = this;
  this_00 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_00;
  iVar1 = ::deLog2Floor32(this->m_size);
  dVar2 = iVar1 + 1;
  step = 0;
  levelNdx = dVar2;
  while ((int)step < 6) {
    for (inc = 0; (int)inc < levelNdx; inc = inc + 1) {
      dec = (deUint32)(0xff / (long)(levelNdx + -1));
      rgb = ::deClamp32(dec * inc,0,0xff);
      color = 0xff - rgb;
      local_38 = 0;
      switch(step) {
      case 0:
        local_38 = rgb << 0x10 | color * 0x100 | 0xff;
        break;
      case 1:
        local_38 = rgb << 8 | 0xff0000 | color;
        break;
      case 2:
        local_38 = color * 0x10000 | 0xff00 | rgb;
        break;
      case 3:
        local_38 = color * 0x10000 | rgb << 8 | 0xff;
        break;
      case 4:
        local_38 = color * 0x100 | 0xff0000 | rgb;
        break;
      case 5:
        local_38 = rgb << 0x10 | 0xff00 | color;
      }
      local_3c = local_38 | 0xff000000;
      pTVar3 = glu::TextureCube::getRefTexture(this->m_texture);
      tcu::TextureCube::allocLevel(pTVar3,step,inc);
      pTVar3 = glu::TextureCube::getRefTexture(this->m_texture);
      access = tcu::TextureCube::getLevelFace(pTVar3,inc,step);
      tcu::RGBA::RGBA(&local_50,local_3c);
      tcu::RGBA::toVec((RGBA *)&local_4c);
      tcu::clear(access,&local_4c);
    }
    dVar2 = step + 1;
    step = dVar2;
  }
  return dVar2;
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	m_texture = new glu::TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}